

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O0

ROMInfo ** MT32Emu::ROMInfo::getFullROMInfos(Bit32u *itemCount)

{
  ROMInfoLists *pRVar1;
  Bit32u *itemCount_local;
  
  if (itemCount != (Bit32u *)0x0) {
    pRVar1 = getROMInfoLists();
    *itemCount = (pRVar1->fullROMInfos).itemCount;
  }
  pRVar1 = getROMInfoLists();
  return (pRVar1->fullROMInfos).romInfos;
}

Assistant:

const ROMInfo * const *ROMInfo::getFullROMInfos(Bit32u *itemCount) {
	if (itemCount != NULL) *itemCount = getROMInfoLists().fullROMInfos.itemCount;
	return getROMInfoLists().fullROMInfos.romInfos;
}